

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6f47f7::MiniScriptTest::Test
          (MiniScriptTest *this,string *ms,string *hexscript,int mode,KeyConverter *converter,
          int opslimit,int stacklimit,optional<unsigned_int> max_wit_size,
          optional<unsigned_int> stack_exec)

{
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  bool bVar1;
  uint *puVar2;
  uint in_ECX;
  string *in_RDX;
  KeyConverter *in_RSI;
  MiniScriptTest *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  bool is_tapscript;
  NodeRef<typename_KeyConverter::Key> inferred_miniscript;
  NodeRef<typename_KeyConverter::Key> node;
  CScript computed_script;
  Node<CPubKey> *in_stack_fffffffffffff158;
  undefined7 in_stack_fffffffffffff160;
  undefined1 in_stack_fffffffffffff167;
  undefined4 in_stack_fffffffffffff168;
  Type in_stack_fffffffffffff16c;
  Node<CPubKey> *in_stack_fffffffffffff170;
  Node<CPubKey> *in_stack_fffffffffffff178;
  undefined4 in_stack_fffffffffffff180;
  uint in_stack_fffffffffffff184;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffff188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff190;
  const_string *file;
  undefined7 in_stack_fffffffffffff198;
  undefined1 in_stack_fffffffffffff19f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff1a0;
  char *in_stack_fffffffffffff1a8;
  uchar *in_stack_fffffffffffff1e0;
  size_t in_stack_fffffffffffff1e8;
  undefined4 in_stack_fffffffffffff3a0;
  const_string local_c40 [13];
  lazy_ostream local_b70 [2];
  assertion_result local_b50 [2];
  const_string local_b18 [13];
  lazy_ostream local_a48 [2];
  assertion_result local_a28 [2];
  const_string local_9f0 [13];
  lazy_ostream local_920 [2];
  assertion_result local_900 [2];
  const_string local_8c8 [13];
  lazy_ostream local_7f8 [2];
  assertion_result local_7d8 [2];
  const_string local_7a0;
  lazy_ostream local_790 [2];
  assertion_result local_770 [2];
  const_string local_738;
  lazy_ostream local_728 [2];
  assertion_result local_708 [3];
  const_string local_6c0;
  lazy_ostream local_6b0 [2];
  uint32_t local_68c;
  assertion_result local_688 [2];
  const_string local_650;
  lazy_ostream local_640 [2];
  assertion_result local_620 [2];
  const_string local_5e8;
  lazy_ostream local_5d8 [2];
  assertion_result local_5b8 [2];
  const_string local_580 [2];
  lazy_ostream local_560 [3];
  assertion_result local_530 [2];
  const_string local_4f8;
  lazy_ostream local_4e8 [2];
  assertion_result local_4c8 [2];
  const_string local_490;
  lazy_ostream local_480 [2];
  assertion_result local_460 [2];
  const_string local_428;
  lazy_ostream local_418 [2];
  assertion_result local_3f8 [2];
  const_string local_3c0;
  lazy_ostream local_3b0 [2];
  assertion_result local_390 [2];
  const_string local_358;
  lazy_ostream local_348 [2];
  assertion_result local_328 [3];
  int local_2dc;
  _Optional_payload_base<unsigned_int> local_2d8;
  _Optional_payload_base<unsigned_int> local_2d0;
  _Optional_payload_base<unsigned_int> local_2c8;
  _Optional_payload_base<unsigned_int> local_2c0;
  _Optional_payload_base<unsigned_int> local_2b8;
  _Optional_payload_base<unsigned_int> local_2b0;
  _Optional_payload_base<unsigned_int> local_2a8;
  _Optional_payload_base<unsigned_int> local_2a0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2dc = in_R9D;
  miniscript::FromString<(anonymous_namespace)::KeyConverter>
            ((string *)in_stack_fffffffffffff170,
             (KeyConverter *)CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168));
  KeyConverter::MsContext((KeyConverter *)in_stack_fffffffffffff158);
  bVar1 = miniscript::IsTapscript((MiniscriptContext)in_stack_fffffffffffff158);
  if (((in_ECX == 0) || (((in_ECX & 0x10) != 0 && (!bVar1)))) || (((in_ECX & 0x20) != 0 && (bVar1)))
     ) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                          *)in_stack_fffffffffffff158);
      if (bVar1) {
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        miniscript::Node<CPubKey>::IsValid(in_stack_fffffffffffff170);
      }
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_328,local_348,&local_358,0x1c8,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      boost::test_tools::assertion_result::
      assertion_result<std::shared_ptr<miniscript::Node<CPubKey>const>>
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)
                 CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_390,local_3b0,&local_3c0,0x1ca,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      miniscript::Node<CPubKey>::IsValid(in_stack_fffffffffffff170);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_3f8,local_418,&local_428,0x1cb,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      miniscript::Node<CPubKey>::IsValidTopLevel(in_stack_fffffffffffff170);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_460,local_480,&local_490,0x1cc,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::
    __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)in_stack_fffffffffffff158);
    miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
              (in_stack_fffffffffffff178,(KeyConverter *)in_stack_fffffffffffff170);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      miniscript::Node<CPubKey>::ScriptSize(in_stack_fffffffffffff158);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_4c8,local_4e8,&local_4f8,0x1ce,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                            (char *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                   (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                   (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
        Span<const_unsigned_char>::Span<CScript>
                  ((Span<const_unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (CScript *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   in_stack_fffffffffffff158);
        s.m_size = in_stack_fffffffffffff1e8;
        s.m_data = in_stack_fffffffffffff1e0;
        HexStr_abi_cxx11_(s);
        std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff188,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (bool)in_stack_fffffffffffff167);
        boost::unit_test::lazy_ostream::instance();
        std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff170,
                       (char *)CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                      );
        Span<const_unsigned_char>::Span<CScript>
                  ((Span<const_unsigned_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (CScript *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   in_stack_fffffffffffff158);
        s_00.m_size = in_stack_fffffffffffff1e8;
        s_00.m_data = in_stack_fffffffffffff1e0;
        HexStr_abi_cxx11_(s_00);
        std::operator+(in_stack_fffffffffffff190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff188);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff170,
                       (char *)CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff170,
                       (char *)CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                      );
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_530,local_560,local_580,0x1cf,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff158);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      miniscript::Node<CPubKey>::IsNonMalleable
                ((Node<CPubKey> *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_5b8,local_5d8,&local_5e8,0x1d0,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      miniscript::Node<CPubKey>::NeedsSignature
                ((Node<CPubKey> *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_620,local_640,&local_650,0x1d1,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      local_68c = (uint32_t)
                  miniscript::Node<CPubKey>::GetType
                            ((Node<CPubKey> *)
                             CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
      miniscript::Type::operator<<
                ((Type *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 in_stack_fffffffffffff16c);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_688,local_6b0,&local_6c0,0x1d2,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    miniscript::FromScript<(anonymous_namespace)::KeyConverter>
              ((CScript *)in_stack_fffffffffffff1a0,
               (KeyConverter *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      boost::test_tools::assertion_result::
      assertion_result<std::shared_ptr<miniscript::Node<CPubKey>const>>
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (shared_ptr<const_miniscript::Node<CPubKey>_> *)
                 CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_708,local_728,&local_738,0x1d4,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                 (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                 (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
      std::
      __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff158);
      miniscript::Node<CPubKey>::ToScript<(anonymous_namespace)::KeyConverter>
                (in_stack_fffffffffffff178,(KeyConverter *)in_stack_fffffffffffff170);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff170,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (bool)in_stack_fffffffffffff167);
      boost::unit_test::lazy_ostream::instance();
      std::operator+(in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                 (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                 (unsigned_long)in_stack_fffffffffffff158);
      in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_770,local_790,&local_7a0,0x1d5,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffff158);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff158);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff158);
      CScript::~CScript((CScript *)in_stack_fffffffffffff158);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    if (local_2dc != -1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                   (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                   (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2a0 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetOps
                              ((Node<CPubKey> *)
                               CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                              );
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (bool)in_stack_fffffffffffff167);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [21])in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [3])in_stack_fffffffffffff158);
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2a8 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetOps
                              ((Node<CPubKey> *)
                               CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                              );
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   &in_stack_fffffffffffff158->fragment);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [5])in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (int *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [2])in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_7d8,local_7f8,local_8c8,0x1d6,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>,_char[2],_const_char_(&)[2]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>,_char[2],_const_char_(&)[2]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[21],_const_char_(&)[21]>
                            *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff158);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    if (in_stack_00000008 != -1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                   (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                   (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2b0 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetStackSize
                              ((Node<CPubKey> *)
                               CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                              );
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (bool)in_stack_fffffffffffff167);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [23])in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [3])in_stack_fffffffffffff158);
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2b8 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetStackSize
                              ((Node<CPubKey> *)
                               CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                              );
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   &in_stack_fffffffffffff158->fragment);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [5])in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (int *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [2])in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_900,local_920,local_9f0,0x1d7,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>,_char[2],_const_char_(&)[2]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>,_char[2],_const_char_(&)[2]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_int,_const_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[23],_const_char_(&)[23]>
                            *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff158);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)in_stack_fffffffffffff158);
    if (bVar1) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                   (const_string *)in_stack_fffffffffffff190,(size_t)in_stack_fffffffffffff188,
                   (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2c0 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetWitnessSize
                              ((Node<CPubKey> *)
                               CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (bool)in_stack_fffffffffffff167);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [30])in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [3])in_stack_fffffffffffff158);
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2c8 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetWitnessSize
                              ((Node<CPubKey> *)
                               CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160));
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   &in_stack_fffffffffffff158->fragment);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [5])in_stack_fffffffffffff158);
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   &in_stack_fffffffffffff158->fragment);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [2])in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_a28,local_a48,local_b18,0x1d8,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>
                            *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff158);
        in_stack_fffffffffffff19f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff19f);
    }
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<unsigned_int> *)in_stack_fffffffffffff158);
    if (bVar1) {
      do {
        file = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff158);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198),
                   file,(size_t)in_stack_fffffffffffff188,
                   (const_string *)CONCAT44(in_stack_fffffffffffff184,in_stack_fffffffffffff180));
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        in_stack_fffffffffffff188 =
             (_Optional_payload_base<unsigned_int>)
             miniscript::Node<CPubKey>::GetExecStackSize
                       ((Node<CPubKey> *)
                        CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168));
        local_2d0 = in_stack_fffffffffffff188;
        puVar2 = std::optional<unsigned_int>::operator*
                           ((optional<unsigned_int> *)in_stack_fffffffffffff158);
        in_stack_fffffffffffff184 = *puVar2;
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (bool)in_stack_fffffffffffff167);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [33])in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [3])in_stack_fffffffffffff158);
        std::
        __shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff158);
        local_2d8 = (_Optional_payload_base<unsigned_int>)
                    miniscript::Node<CPubKey>::GetExecStackSize
                              ((Node<CPubKey> *)
                               CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168)
                              );
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   &in_stack_fffffffffffff158->fragment);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [5])in_stack_fffffffffffff158);
        std::optional<unsigned_int>::operator*((optional<unsigned_int> *)in_stack_fffffffffffff158);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   &in_stack_fffffffffffff158->fragment);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>
                    *)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (char (*) [2])in_stack_fffffffffffff158);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT44(in_stack_fffffffffffff16c.m_flags,in_stack_fffffffffffff168),
                   (pointer)CONCAT17(in_stack_fffffffffffff167,in_stack_fffffffffffff160),
                   (unsigned_long)in_stack_fffffffffffff158);
        in_stack_fffffffffffff158 = (Node<CPubKey> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_b50,local_b70,local_c40,0x1d9,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>,_char[2],_const_char_(&)[2]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>,_unsigned_int,_const_unsigned_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>,_char[5],_const_char_(&)[5]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>,_unsigned_int,_const_unsigned_int_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_char[3],_const_char_(&)[3]>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffff158);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>
                            *)in_stack_fffffffffffff158);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff158);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
        in_stack_fffffffffffff16c.m_flags = CONCAT13(bVar1,(int3)in_stack_fffffffffffff16c.m_flags);
      } while (bVar1);
    }
    TestSatisfy(in_RDI,in_RSI,in_RDX,(NodeRef *)CONCAT44(in_ECX,in_stack_fffffffffffff3a0));
    std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
              ((shared_ptr<const_miniscript::Node<CPubKey>_> *)in_stack_fffffffffffff158);
    CScript::~CScript((CScript *)in_stack_fffffffffffff158);
  }
  std::shared_ptr<const_miniscript::Node<CPubKey>_>::~shared_ptr
            ((shared_ptr<const_miniscript::Node<CPubKey>_> *)in_stack_fffffffffffff158);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Test(const std::string& ms, const std::string& hexscript, int mode, const KeyConverter& converter,
          int opslimit = -1, int stacklimit = -1, std::optional<uint32_t> max_wit_size = std::nullopt,
          std::optional<uint32_t> stack_exec = {})
{
    auto node = miniscript::FromString(ms, converter);
    const bool is_tapscript{miniscript::IsTapscript(converter.MsContext())};
    if (mode == TESTMODE_INVALID || ((mode & TESTMODE_P2WSH_INVALID) && !is_tapscript) || ((mode & TESTMODE_TAPSCRIPT_INVALID) && is_tapscript)) {
        BOOST_CHECK_MESSAGE(!node || !node->IsValid(), "Unexpectedly valid: " + ms);
    } else {
        BOOST_CHECK_MESSAGE(node, "Unparseable: " + ms);
        BOOST_CHECK_MESSAGE(node->IsValid(), "Invalid: " + ms);
        BOOST_CHECK_MESSAGE(node->IsValidTopLevel(), "Invalid top level: " + ms);
        auto computed_script = node->ToScript(converter);
        BOOST_CHECK_MESSAGE(node->ScriptSize() == computed_script.size(), "Script size mismatch: " + ms);
        if (hexscript != "?") BOOST_CHECK_MESSAGE(HexStr(computed_script) == hexscript, "Script mismatch: " + ms + " (" + HexStr(computed_script) + " vs " + hexscript + ")");
        BOOST_CHECK_MESSAGE(node->IsNonMalleable() == !!(mode & TESTMODE_NONMAL), "Malleability mismatch: " + ms);
        BOOST_CHECK_MESSAGE(node->NeedsSignature() == !!(mode & TESTMODE_NEEDSIG), "Signature necessity mismatch: " + ms);
        BOOST_CHECK_MESSAGE((node->GetType() << "k"_mst) == !(mode & TESTMODE_TIMELOCKMIX), "Timelock mix mismatch: " + ms);
        auto inferred_miniscript = miniscript::FromScript(computed_script, converter);
        BOOST_CHECK_MESSAGE(inferred_miniscript, "Cannot infer miniscript from script: " + ms);
        BOOST_CHECK_MESSAGE(inferred_miniscript->ToScript(converter) == computed_script, "Roundtrip failure: miniscript->script != miniscript->script->miniscript->script: " + ms);
        if (opslimit != -1) BOOST_CHECK_MESSAGE((int)*node->GetOps() == opslimit, "Ops limit mismatch: " << ms << " (" << *node->GetOps() << " vs " << opslimit << ")");
        if (stacklimit != -1) BOOST_CHECK_MESSAGE((int)*node->GetStackSize() == stacklimit, "Stack limit mismatch: " << ms << " (" << *node->GetStackSize() << " vs " << stacklimit << ")");
        if (max_wit_size) BOOST_CHECK_MESSAGE(*node->GetWitnessSize() == *max_wit_size, "Witness size limit mismatch: " << ms << " (" << *node->GetWitnessSize() << " vs " << *max_wit_size << ")");
        if (stack_exec) BOOST_CHECK_MESSAGE(*node->GetExecStackSize() == *stack_exec, "Stack execution limit mismatch: " << ms << " (" << *node->GetExecStackSize() << " vs " << *stack_exec << ")");
        TestSatisfy(converter, ms, node);
    }
}